

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

Edge * __thiscall
anon_unknown.dwarf_116792::VertexIdEdgeVectorShape::chain_edge
          (Edge *__return_storage_ptr__,VertexIdEdgeVectorShape *this,int i,int j)

{
  edge(__return_storage_ptr__,this,i);
  return __return_storage_ptr__;
}

Assistant:

Edge chain_edge(int i, int j) const override { return edge(i); }